

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O0

bool re2::RE2::Replace(string *str,RE2 *re,StringPiece *rewrite)

{
  bool bVar1;
  const_pointer pcVar2;
  long lVar3;
  ulong uVar4;
  string *psVar5;
  ulong in_RDI;
  string s;
  int nvec;
  StringPiece vec [17];
  int in_stack_000001dc;
  StringPiece *in_stack_000001e0;
  StringPiece *in_stack_000001e8;
  string *in_stack_000001f0;
  RE2 *in_stack_000001f8;
  StringPiece *in_stack_00000e70;
  Anchor in_stack_00000e7c;
  size_t in_stack_00000e80;
  size_t in_stack_00000e88;
  StringPiece *in_stack_00000e90;
  RE2 *in_stack_00000e98;
  int in_stack_00000eb0;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  StringPiece *in_stack_fffffffffffffe30;
  StringPiece *in_stack_fffffffffffffe50;
  StringPiece *local_188;
  string local_170 [52];
  int local_13c;
  StringPiece local_138 [17];
  StringPiece SStack_28;
  ulong local_10;
  byte local_1;
  
  local_188 = local_138;
  local_10 = in_RDI;
  do {
    StringPiece::StringPiece(local_188);
    local_188 = local_188 + 1;
  } while (local_188 != &SStack_28);
  local_13c = MaxSubmatch(in_stack_fffffffffffffe50);
  local_13c = local_13c + 1;
  if (local_13c < 0x12) {
    StringPiece::StringPiece
              (in_stack_fffffffffffffe30,
               (string *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    std::__cxx11::string::size();
    bVar1 = Match(in_stack_00000e98,in_stack_00000e90,in_stack_00000e88,in_stack_00000e80,
                  in_stack_00000e7c,in_stack_00000e70,in_stack_00000eb0);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      std::__cxx11::string::string(local_170);
      local_1 = Rewrite(in_stack_000001f8,in_stack_000001f0,in_stack_000001e8,in_stack_000001e0,
                        in_stack_000001dc);
      if ((bool)local_1) {
        pcVar2 = StringPiece::data(local_138);
        lVar3 = std::__cxx11::string::data();
        uVar4 = (long)pcVar2 - lVar3;
        psVar5 = (string *)StringPiece::size(local_138);
        std::__cxx11::string::replace(local_10,uVar4,psVar5);
      }
      std::__cxx11::string::~string(local_170);
    }
    else {
      local_1 = 0;
    }
  }
  else {
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool RE2::Replace(std::string* str,
                  const RE2& re,
                  const StringPiece& rewrite) {
  StringPiece vec[kVecSize];
  int nvec = 1 + MaxSubmatch(rewrite);
  if (nvec > static_cast<int>(arraysize(vec)))
    return false;
  if (!re.Match(*str, 0, str->size(), UNANCHORED, vec, nvec))
    return false;

  std::string s;
  if (!re.Rewrite(&s, rewrite, vec, nvec))
    return false;

  assert(vec[0].data() >= str->data());
  assert(vec[0].data() + vec[0].size() <= str->data() + str->size());
  str->replace(vec[0].data() - str->data(), vec[0].size(), s);
  return true;
}